

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

App * __thiscall CLI::App::add_subcommand(App *this,string *name,string *description)

{
  pointer *ppuVar1;
  pointer pcVar2;
  iterator __position;
  pointer puVar3;
  App *pAVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  bool bVar7;
  App *pAVar8;
  OptionAlreadyAdded *this_00;
  pointer puVar9;
  string local_b8;
  _Head_base<0UL,_CLI::App_*,_false> local_98;
  string local_90;
  string local_70;
  string local_50;
  
  pAVar8 = (App *)operator_new(0x1d0);
  pcVar2 = (description->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + description->_M_string_length);
  App(pAVar8,&local_70,this);
  __position._M_current =
       (this->subcommands_).
       super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_98._M_head_impl = pAVar8;
  if (__position._M_current ==
      (this->subcommands_).
      super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::
    vector<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>,std::allocator<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>>>
    ::_M_realloc_insert<CLI::App*>
              ((vector<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>,std::allocator<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>>>
                *)&this->subcommands_,__position,&local_98._M_head_impl);
  }
  else {
    ((__position._M_current)->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>.
    _M_t.super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
    super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl = pAVar8;
    ppuVar1 = &(this->subcommands_).
               super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  ::std::__cxx11::string::_M_assign
            ((string *)
             &((this->subcommands_).
               super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
               super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
               super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl)->name_);
  puVar9 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 != puVar3) {
    do {
      pAVar8 = (puVar9->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
               super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
               super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
      pAVar4 = (this->subcommands_).
               super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
               super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
               super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
      if (pAVar8 != pAVar4) {
        pcVar2 = (pAVar4->name_)._M_dataplus._M_p;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar2,pcVar2 + (pAVar4->name_)._M_string_length);
        bVar6 = check_name(pAVar8,&local_90);
        bVar7 = true;
        if (!bVar6) {
          pAVar8 = (this->subcommands_).
                   super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                   super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                   super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
          pAVar4 = (puVar9->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>.
                   _M_t.super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                   super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          _Var5._M_p = (pAVar4->name_)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,_Var5._M_p,_Var5._M_p + (pAVar4->name_)._M_string_length);
          bVar7 = check_name(pAVar8,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if (bVar7 != false) {
          this_00 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
          pAVar8 = (puVar9->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>.
                   _M_t.super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                   super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          _Var5._M_p = (pAVar8->name_)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,_Var5._M_p,_Var5._M_p + (pAVar8->name_)._M_string_length);
          OptionAlreadyAdded::OptionAlreadyAdded(this_00,&local_50);
          __cxa_throw(this_00,&OptionAlreadyAdded::typeinfo,Error::~Error);
        }
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar3);
  }
  return (this->subcommands_).
         super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
         super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
         super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
}

Assistant:

App *add_subcommand(std::string name, std::string description = "") {
        subcommands_.emplace_back(new App(description, this));
        subcommands_.back()->name_ = name;
        for(const auto &subc : subcommands_)
            if(subc.get() != subcommands_.back().get())
                if(subc->check_name(subcommands_.back()->name_) || subcommands_.back()->check_name(subc->name_))
                    throw OptionAlreadyAdded(subc->name_);
        return subcommands_.back().get();
    }